

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  uint uVar1;
  UninterpretedOption *pUVar2;
  DescriptorPool *pDVar3;
  double value;
  bool bVar4;
  byte bVar5;
  CppType CVar6;
  Type TVar7;
  EnumDescriptor *pEVar8;
  DescriptorPool *pDVar9;
  anon_union_8_8_13f84498_for_Symbol_2 aVar10;
  uint64 uVar11;
  int iVar12;
  string *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong uVar13;
  float value_00;
  double f;
  Symbol SVar14;
  string fully_qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CVar6 = FieldDescriptor::cpp_type(option_field);
  switch(CVar6) {
  case CPPTYPE_INT32:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) == 0) {
        std::operator+(&local_f8,"Value must be integer for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        std::operator+(&fully_qualified_name,&local_f8,"\".");
        bVar5 = AddValueError(this,&fully_qualified_name);
      }
      else {
        uVar13 = pUVar2->negative_int_value_;
        if (-0x80000001 < (long)uVar13) goto LAB_002ecb1b;
        std::operator+(&local_f8,"Value out of range for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        std::operator+(&fully_qualified_name,&local_f8,"\".");
        bVar5 = AddValueError(this,&fully_qualified_name);
      }
    }
    else {
      uVar13 = pUVar2->positive_int_value_;
      if ((uVar13 & 0xffffffff80000000) == 0) {
LAB_002ecb1b:
        iVar12 = *(int *)(option_field + 0x38);
        TVar7 = FieldDescriptor::type(option_field);
        SetInt32((OptionInterpreter *)option_field,iVar12,(int32)uVar13,TVar7,unknown_fields);
        goto switchD_002ec507_default;
      }
      std::operator+(&local_f8,"Value out of range for int32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      std::operator+(&fully_qualified_name,&local_f8,"\".");
      bVar5 = AddValueError(this,&fully_qualified_name);
    }
    break;
  case CPPTYPE_INT64:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) != 0) {
        iVar12 = *(int *)(option_field + 0x38);
        uVar11 = pUVar2->negative_int_value_;
LAB_002ecb43:
        TVar7 = FieldDescriptor::type(option_field);
        SetInt64((OptionInterpreter *)option_field,iVar12,uVar11,TVar7,unknown_fields);
        goto switchD_002ec507_default;
      }
      std::operator+(&local_f8,"Value must be integer for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      std::operator+(&fully_qualified_name,&local_f8,"\".");
      bVar5 = AddValueError(this,&fully_qualified_name);
    }
    else {
      uVar11 = pUVar2->positive_int_value_;
      if (-1 < (long)uVar11) {
        iVar12 = *(int *)(option_field + 0x38);
        goto LAB_002ecb43;
      }
      std::operator+(&local_f8,"Value out of range for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      std::operator+(&fully_qualified_name,&local_f8,"\".");
      bVar5 = AddValueError(this,&fully_qualified_name);
    }
    break;
  case CPPTYPE_UINT32:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) == 0) {
      std::operator+(&local_f8,"Value must be non-negative integer for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      std::operator+(&fully_qualified_name,&local_f8,"\".");
      bVar5 = AddValueError(this,&fully_qualified_name);
    }
    else {
      uVar13 = this->uninterpreted_option_->positive_int_value_;
      if (uVar13 >> 0x20 == 0) {
        iVar12 = *(int *)(option_field + 0x38);
        TVar7 = FieldDescriptor::type(option_field);
        SetUInt32((OptionInterpreter *)option_field,iVar12,(uint32)uVar13,TVar7,unknown_fields);
        goto switchD_002ec507_default;
      }
      std::operator+(&local_f8,"Value out of range for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      std::operator+(&fully_qualified_name,&local_f8,"\".");
      bVar5 = AddValueError(this,&fully_qualified_name);
    }
    break;
  case CPPTYPE_UINT64:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) != 0) {
      iVar12 = *(int *)(option_field + 0x38);
      uVar11 = this->uninterpreted_option_->positive_int_value_;
      TVar7 = FieldDescriptor::type(option_field);
      SetUInt64((OptionInterpreter *)option_field,iVar12,uVar11,TVar7,unknown_fields);
      goto switchD_002ec507_default;
    }
    std::operator+(&local_f8,"Value must be non-negative integer for uint64 option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    std::operator+(&fully_qualified_name,&local_f8,"\".");
    bVar5 = AddValueError(this,&fully_qualified_name);
    break;
  case CPPTYPE_DOUBLE:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) == 0) {
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 0x10) == 0) {
          std::operator+(&local_f8,"Value must be number for double option \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          std::operator+(&fully_qualified_name,&local_f8,"\".");
          bVar5 = AddValueError(this,&fully_qualified_name);
          break;
        }
        value = (double)pUVar2->negative_int_value_;
      }
      else {
        value = ((double)CONCAT44(0x45300000,(int)(pUVar2->positive_int_value_ >> 0x20)) -
                1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)pUVar2->positive_int_value_) - 4503599627370496.0)
        ;
      }
    }
    else {
      value = pUVar2->double_value_;
    }
    UnknownFieldSet::AddFixed64(unknown_fields,*(int *)(option_field + 0x38),(uint64)value);
  default:
switchD_002ec507_default:
    bVar5 = 1;
    goto LAB_002eccb2;
  case CPPTYPE_FLOAT:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) == 0) {
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 0x10) == 0) {
          std::operator+(&local_f8,"Value must be number for float option \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          std::operator+(&fully_qualified_name,&local_f8,"\".");
          bVar5 = AddValueError(this,&fully_qualified_name);
          break;
        }
        value_00 = (float)pUVar2->negative_int_value_;
      }
      else {
        uVar13 = pUVar2->positive_int_value_;
        if ((long)uVar13 < 0) {
          value_00 = (float)uVar13;
        }
        else {
          value_00 = (float)(long)uVar13;
        }
      }
    }
    else {
      value_00 = (float)pUVar2->double_value_;
    }
    UnknownFieldSet::AddFixed32(unknown_fields,*(int *)(option_field + 0x38),(uint32)value_00);
    goto switchD_002ec507_default;
  case CPPTYPE_BOOL:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 1) != 0) {
      bVar4 = std::operator==((this->uninterpreted_option_->identifier_value_).ptr_,"true");
      if (bVar4) {
        uVar11 = 1;
      }
      else {
        bVar4 = std::operator==((this->uninterpreted_option_->identifier_value_).ptr_,"false");
        if (!bVar4) {
          std::operator+(&local_f8,"Value must be \"true\" or \"false\" for boolean option \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          std::operator+(&fully_qualified_name,&local_f8,"\".");
          bVar5 = AddValueError(this,&fully_qualified_name);
          break;
        }
        uVar11 = 0;
      }
      iVar12 = *(int *)(option_field + 0x38);
LAB_002ecca7:
      UnknownFieldSet::AddVarint(unknown_fields,iVar12,uVar11);
      goto switchD_002ec507_default;
    }
    std::operator+(&local_f8,"Value must be identifier for boolean option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    std::operator+(&fully_qualified_name,&local_f8,"\".");
    bVar5 = AddValueError(this,&fully_qualified_name);
    break;
  case CPPTYPE_ENUM:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 1) == 0) {
      std::operator+(&local_f8,"Value must be identifier for enum-valued option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      std::operator+(&fully_qualified_name,&local_f8,"\".");
      bVar5 = AddValueError(this,&fully_qualified_name);
      break;
    }
    pEVar8 = FieldDescriptor::enum_type(option_field);
    key = (this->uninterpreted_option_->identifier_value_).ptr_;
    pDVar3 = *(DescriptorPool **)(*(long *)(pEVar8 + 0x10) + 0x10);
    pDVar9 = DescriptorPool::generated_pool();
    if (pDVar3 == pDVar9) {
      aVar10.enum_value_descriptor = EnumDescriptor::FindValueByName(pEVar8,key);
    }
    else {
      local_d8 = key;
      std::__cxx11::string::string((string *)&fully_qualified_name,*(string **)(pEVar8 + 8));
      std::__cxx11::string::resize((ulong)&fully_qualified_name);
      std::__cxx11::string::append((string *)&fully_qualified_name);
      SVar14 = FindSymbolNotEnforcingDeps(this->builder_,&fully_qualified_name,true);
      aVar10 = SVar14.field_1;
      if (SVar14.type == ENUM_VALUE) {
        if (*(EnumDescriptor **)(aVar10.descriptor + 0x18) == pEVar8) {
          bVar4 = true;
        }
        else {
          std::operator+(&local_50,"Enum type \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (pEVar8 + 8));
          std::operator+(&local_70,&local_50,"\" has no value named \"");
          std::operator+(&local_d0,&local_70,local_d8);
          std::operator+(&local_b0,&local_d0,"\" for option \"");
          std::operator+(&local_90,&local_b0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          std::operator+(&local_f8,&local_90,"\". This appears to be a value from a sibling type.");
          bVar4 = AddValueError(this,&local_f8);
          key = (string *)(ulong)bVar4;
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          bVar4 = false;
          aVar10.descriptor = (Descriptor *)0x0;
        }
      }
      else {
        bVar4 = true;
        aVar10.descriptor = (Descriptor *)0x0;
      }
      bVar5 = (byte)key;
      std::__cxx11::string::~string((string *)&fully_qualified_name);
      key = local_d8;
      if (!bVar4) goto LAB_002eccb2;
    }
    if (aVar10.descriptor != (Descriptor *)0x0) {
      iVar12 = *(int *)(option_field + 0x38);
      uVar11 = (uint64)*(int *)(aVar10.descriptor + 0x10);
      goto LAB_002ecca7;
    }
    pEVar8 = FieldDescriptor::enum_type(option_field);
    std::operator+(&local_70,"Enum type \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pEVar8 + 8));
    std::operator+(&local_d0,&local_70,"\" has no value named \"");
    std::operator+(&local_b0,&local_d0,key);
    std::operator+(&local_90,&local_b0,"\" for option \"");
    std::operator+(&local_f8,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    std::operator+(&fully_qualified_name,&local_f8,"\".");
    bVar5 = AddValueError(this,&fully_qualified_name);
    std::__cxx11::string::~string((string *)&fully_qualified_name);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    this_00 = &local_70;
    goto LAB_002ecc7d;
  case CPPTYPE_STRING:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 2) != 0) {
      UnknownFieldSet::AddLengthDelimited
                (unknown_fields,*(int *)(option_field + 0x38),
                 (this->uninterpreted_option_->string_value_).ptr_);
      goto switchD_002ec507_default;
    }
    std::operator+(&local_f8,"Value must be quoted string for string option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    std::operator+(&fully_qualified_name,&local_f8,"\".");
    bVar5 = AddValueError(this,&fully_qualified_name);
    break;
  case CPPTYPE_MESSAGE:
    bVar4 = SetAggregateOption(this,option_field,unknown_fields);
    if (!bVar4) {
      bVar5 = 0;
      goto LAB_002eccb2;
    }
    goto switchD_002ec507_default;
  }
  std::__cxx11::string::~string((string *)&fully_qualified_name);
  this_00 = &local_f8;
LAB_002ecc7d:
  std::__cxx11::string::~string((string *)this_00);
LAB_002eccb2:
  return (bool)(bVar5 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {

    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint32max)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64>(kint32min)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be integer for int32 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint64max)) {
          return AddValueError("Value out of range for int64 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be integer for int64 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() > kuint32max) {
          return AddValueError("Value out of range for uint32 option \"" +
                               option_field->name() + "\".");
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be non-negative integer for uint32 "
                             "option \"" + option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be non-negative integer for uint64 "
                             "option \"" + option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for float option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed32(option_field->number(),
          google::protobuf::internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for double option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed64(option_field->number(),
          google::protobuf::internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64 value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError("Value must be identifier for boolean option "
                             "\"" + option_field->full_name() + "\".");
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError("Value must be \"true\" or \"false\" for boolean "
                             "option \"" + option_field->full_name() + "\".");
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError("Value must be identifier for enum-valued option "
                             "\"" + option_field->full_name() + "\".");
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = NULL;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        string fully_qualified_name = enum_type->full_name();
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
          builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (!symbol.IsNull() && symbol.type == Symbol::ENUM_VALUE) {
          if (symbol.enum_value_descriptor->type() != enum_type) {
            return AddValueError("Enum type \"" + enum_type->full_name() +
                "\" has no value named \"" + value_name + "\" for option \"" +
                option_field->full_name() +
                "\". This appears to be a value from a sibling type.");
          } else {
            enum_value = symbol.enum_value_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == NULL) {
        return AddValueError("Enum type \"" +
                             option_field->enum_type()->full_name() +
                             "\" has no value named \"" + value_name + "\" for "
                             "option \"" + option_field->full_name() + "\".");
      } else {
        // Sign-extension is not a problem, since we cast directly from int32 to
        // uint64, without first going through uint32.
        unknown_fields->AddVarint(option_field->number(),
          static_cast<uint64>(static_cast<int64>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError("Value must be quoted string for string option "
                             "\"" + option_field->full_name() + "\".");
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
          uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}